

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O2

CURLHcode curl_easy_header(CURL_conflict *easy,char *name,size_t nameindex,uint type,int request,
                          curl_header **hout)

{
  Curl_llist_element *pCVar1;
  void *pvVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  void *pvVar8;
  Curl_llist *list;
  ulong uVar9;
  CURLHcode CVar10;
  Curl_llist *pCVar11;
  Curl_llist_element *local_50;
  
  CVar10 = CURLHE_BAD_ARGUMENT;
  if ((((-2 < request) && (0xffffffe0 < type - 0x20)) && (easy != (CURL_conflict *)0x0)) &&
     ((name != (char *)0x0 && (hout != (curl_header **)0x0)))) {
    list = &(easy->state).httphdrs;
    sVar7 = Curl_llist_count(list);
    if (sVar7 == 0) {
      CVar10 = CURLHE_NOHEADERS;
    }
    else {
      iVar4 = (easy->state).requests;
      if (iVar4 < request) {
        CVar10 = CURLHE_NOREQUEST;
      }
      else {
        if (request != -1) {
          iVar4 = request;
        }
        local_50 = (Curl_llist_element *)0x0;
        uVar9 = 0;
        pvVar8 = (void *)0x0;
        pCVar11 = list;
        while (pCVar1 = pCVar11->head, pCVar1 != (Curl_llist_element *)0x0) {
          pvVar2 = pCVar1->ptr;
          iVar5 = Curl_strcasecompare(*(char **)((long)pvVar2 + 0x18),name);
          if (((iVar5 != 0) && ((type & *(byte *)((long)pvVar2 + 0x2c)) != 0)) &&
             (*(int *)((long)pvVar2 + 0x28) == iVar4)) {
            uVar9 = uVar9 + 1;
            pvVar8 = pvVar2;
            local_50 = pCVar1;
          }
          pCVar11 = (Curl_llist *)&pCVar1->next;
        }
        CVar10 = CURLHE_MISSING;
        if (uVar9 != 0) {
          if (nameindex < uVar9) {
            if (uVar9 - 1 == nameindex) {
              uVar6 = (uint)*(byte *)((long)pvVar8 + 0x2c);
LAB_004b73d5:
              *hout = &(easy->state).headerout;
              pcVar3 = *(char **)((long)pvVar8 + 0x20);
              (easy->state).headerout.name = *(char **)((long)pvVar8 + 0x18);
              (easy->state).headerout.value = pcVar3;
              (easy->state).headerout.amount = uVar9;
              (easy->state).headerout.index = nameindex;
              (easy->state).headerout.origin = uVar6 | 0x8000000;
              (easy->state).headerout.anchor = local_50;
              CVar10 = CURLHE_OK;
            }
            else {
              sVar7 = 0;
              while (local_50 = list->head, local_50 != (Curl_llist_element *)0x0) {
                pvVar8 = local_50->ptr;
                iVar5 = Curl_strcasecompare(*(char **)((long)pvVar8 + 0x18),name);
                if (((iVar5 != 0) &&
                    (uVar6 = (uint)*(byte *)((long)pvVar8 + 0x2c), (type & uVar6) != 0)) &&
                   (*(int *)((long)pvVar8 + 0x28) == iVar4)) {
                  if (sVar7 == nameindex) goto LAB_004b73d5;
                  sVar7 = sVar7 + 1;
                }
                list = (Curl_llist *)&local_50->next;
              }
            }
          }
          else {
            CVar10 = CURLHE_BADINDEX;
          }
        }
      }
    }
  }
  return CVar10;
}

Assistant:

CURLHcode curl_easy_header(CURL *easy,
                           const char *name,
                           size_t nameindex,
                           unsigned int type,
                           int request,
                           struct curl_header **hout)
{
  struct Curl_llist_element *e;
  struct Curl_llist_element *e_pick = NULL;
  struct Curl_easy *data = easy;
  size_t match = 0;
  size_t amount = 0;
  struct Curl_header_store *hs = NULL;
  struct Curl_header_store *pick = NULL;
  if(!name || !hout || !data ||
     (type > (CURLH_HEADER|CURLH_TRAILER|CURLH_CONNECT|CURLH_1XX|
              CURLH_PSEUDO)) || !type || (request < -1))
    return CURLHE_BAD_ARGUMENT;
  if(!Curl_llist_count(&data->state.httphdrs))
    return CURLHE_NOHEADERS; /* no headers available */
  if(request > data->state.requests)
    return CURLHE_NOREQUEST;
  if(request == -1)
    request = data->state.requests;

  /* we need a first round to count amount of this header */
  for(e = data->state.httphdrs.head; e; e = e->next) {
    hs = e->ptr;
    if(strcasecompare(hs->name, name) &&
       (hs->type & type) &&
       (hs->request == request)) {
      amount++;
      pick = hs;
      e_pick = e;
    }
  }
  if(!amount)
    return CURLHE_MISSING;
  else if(nameindex >= amount)
    return CURLHE_BADINDEX;

  if(nameindex == amount - 1)
    /* if the last or only occurrence is what's asked for, then we know it */
    hs = pick;
  else {
    for(e = data->state.httphdrs.head; e; e = e->next) {
      hs = e->ptr;
      if(strcasecompare(hs->name, name) &&
         (hs->type & type) &&
         (hs->request == request) &&
         (match++ == nameindex)) {
        e_pick = e;
        break;
      }
    }
    if(!e) /* this shouldn't happen */
      return CURLHE_MISSING;
  }
  /* this is the name we want */
  copy_header_external(data, hs, nameindex, amount, e_pick, hout);
  return CURLHE_OK;
}